

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

MemorySectionLimits __thiscall
Wasm::WasmBinaryReader::ReadSectionLimitsBase<Wasm::MemorySectionLimits>
          (WasmBinaryReader *this,uint32 maxInitial,uint32 maxMaximum,char16 *errorMsg)

{
  SectionLimits SVar1;
  bool bVar2;
  uint32 local_34;
  char16 *pcStack_30;
  uint32 length;
  char16 *errorMsg_local;
  uint32 maxMaximum_local;
  uint32 maxInitial_local;
  WasmBinaryReader *this_local;
  uint uStack_10;
  MemorySectionLimits limits;
  
  local_34 = 0;
  pcStack_30 = errorMsg;
  errorMsg_local._0_4_ = maxMaximum;
  errorMsg_local._4_4_ = maxInitial;
  _maxMaximum_local = this;
  this_local._4_4_ = LEB128<unsigned_int,32u>(this,&local_34);
  uStack_10 = LEB128<unsigned_int,32u>(this,&local_34);
  limits.super_SectionLimits.flags = (Flags)errorMsg_local;
  bVar2 = SectionLimits::HasMaximum((SectionLimits *)((long)&this_local + 4));
  if ((bVar2) &&
     (limits.super_SectionLimits.flags = LEB128<unsigned_int,32u>(this,&local_34),
     (Flags)errorMsg_local < limits.super_SectionLimits.flags)) {
    ThrowDecodingError(this,L"Maximum %s",pcStack_30);
  }
  if (uStack_10 <= errorMsg_local._4_4_) {
    SVar1.initial = uStack_10;
    SVar1.flags = this_local._4_4_;
    SVar1.maximum = limits.super_SectionLimits.flags;
    return (MemorySectionLimits)SVar1;
  }
  ThrowDecodingError(this,L"Minimum %s",pcStack_30);
}

Assistant:

SectionLimitType WasmBinaryReader::ReadSectionLimitsBase(uint32 maxInitial, uint32 maxMaximum, const char16* errorMsg)
{
    SectionLimitType limits;
    uint32 length = 0;
    limits.flags = (SectionLimits::Flags)LEB128(length);
    limits.initial = LEB128(length);
    limits.maximum = maxMaximum;
    if (limits.HasMaximum())
    {
        limits.maximum = LEB128(length);
        if (limits.maximum > maxMaximum)
        {
            ThrowDecodingError(_u("Maximum %s"), errorMsg);
        }
    }
    if (limits.initial > maxInitial)
    {
        ThrowDecodingError(_u("Minimum %s"), errorMsg);
    }
    return limits;
}